

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

unsigned_long_long ZSTD_decompressBound(void *src,size_t srcSize)

{
  uint uVar1;
  ulong in_RSI;
  unsigned_long_long decompressedBound;
  size_t compressedSize;
  ZSTD_frameSizeInfo frameSizeInfo;
  unsigned_long_long bound;
  size_t in_stack_00000058;
  void *in_stack_00000060;
  ulong local_30;
  long local_28;
  unsigned_long_long local_20;
  ulong local_18;
  
  local_20 = 0;
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == 0) {
      return local_20;
    }
    ZSTD_findFrameSizeInfo(in_stack_00000060,in_stack_00000058);
    uVar1 = ZSTD_isError(0x2f40c4);
    if ((uVar1 != 0) || (local_28 == -2)) break;
    if (local_18 < local_30) {
      __assert_fail("srcSize >= compressedSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9e82,"unsigned long long ZSTD_decompressBound(const void *, size_t)");
    }
    local_18 = local_18 - local_30;
    local_20 = local_28 + local_20;
  }
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}